

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

ChannelType glu::mapGLChannelType(deUint32 dataType,bool normalized)

{
  ChannelType CStack_c;
  bool normalized_local;
  deUint32 dataType_local;
  
  if (dataType == 0x1400) {
    CStack_c = SIGNED_INT8;
    if (normalized) {
      CStack_c = SNORM_INT8;
    }
  }
  else if (dataType == 0x1401) {
    CStack_c = UNSIGNED_INT8;
    if (normalized) {
      CStack_c = UNORM_INT8;
    }
  }
  else if (dataType == 0x1402) {
    CStack_c = SIGNED_INT16;
    if (normalized) {
      CStack_c = SNORM_INT16;
    }
  }
  else if (dataType == 0x1403) {
    CStack_c = UNSIGNED_INT16;
    if (normalized) {
      CStack_c = UNORM_INT16;
    }
  }
  else if (dataType == 0x1404) {
    CStack_c = SIGNED_INT32;
    if (normalized) {
      CStack_c = SNORM_INT32;
    }
  }
  else if (dataType == 0x1405) {
    CStack_c = UNSIGNED_INT32;
    if (normalized) {
      CStack_c = UNORM_INT32;
    }
  }
  else if (dataType == 0x1406) {
    CStack_c = FLOAT;
  }
  else if (dataType == 0x140b) {
    CStack_c = HALF_FLOAT;
  }
  else if (dataType == 0x8033) {
    CStack_c = UNORM_SHORT_4444;
  }
  else if (dataType == 0x8034) {
    CStack_c = UNORM_SHORT_5551;
  }
  else if (dataType == 0x8363) {
    CStack_c = UNORM_SHORT_565;
  }
  else if (dataType == 0x8368) {
    CStack_c = UNSIGNED_INT_1010102_REV;
    if (normalized) {
      CStack_c = UNORM_INT_1010102_REV;
    }
  }
  else if (dataType == 0x84fa) {
    CStack_c = UNSIGNED_INT_24_8;
  }
  else if (dataType == 0x8c3b) {
    CStack_c = UNSIGNED_INT_11F_11F_10F_REV;
  }
  else if (dataType == 0x8c3e) {
    CStack_c = UNSIGNED_INT_999_E5_REV;
  }
  else if (dataType == 0x8dad) {
    CStack_c = FLOAT_UNSIGNED_INT_24_8_REV;
  }
  else {
    CStack_c = CHANNELTYPE_LAST;
  }
  return CStack_c;
}

Assistant:

static tcu::TextureFormat::ChannelType mapGLChannelType (deUint32 dataType, bool normalized)
{
	// \note Normalized bit is ignored where it doesn't apply.
	using tcu::TextureFormat;

	switch (dataType)
	{
		case GL_UNSIGNED_BYTE:					return normalized ? TextureFormat::UNORM_INT8	: TextureFormat::UNSIGNED_INT8;
		case GL_BYTE:							return normalized ? TextureFormat::SNORM_INT8	: TextureFormat::SIGNED_INT8;
		case GL_UNSIGNED_SHORT:					return normalized ? TextureFormat::UNORM_INT16	: TextureFormat::UNSIGNED_INT16;
		case GL_SHORT:							return normalized ? TextureFormat::SNORM_INT16	: TextureFormat::SIGNED_INT16;
		case GL_UNSIGNED_INT:					return normalized ? TextureFormat::UNORM_INT32	: TextureFormat::UNSIGNED_INT32;
		case GL_INT:							return normalized ? TextureFormat::SNORM_INT32	: TextureFormat::SIGNED_INT32;
		case GL_FLOAT:							return TextureFormat::FLOAT;
		case GL_UNSIGNED_SHORT_4_4_4_4:			return TextureFormat::UNORM_SHORT_4444;
		case GL_UNSIGNED_SHORT_5_5_5_1:			return TextureFormat::UNORM_SHORT_5551;
		case GL_UNSIGNED_SHORT_5_6_5:			return TextureFormat::UNORM_SHORT_565;
		case GL_HALF_FLOAT:						return TextureFormat::HALF_FLOAT;
		case GL_UNSIGNED_INT_2_10_10_10_REV:	return normalized ? TextureFormat::UNORM_INT_1010102_REV : TextureFormat::UNSIGNED_INT_1010102_REV;
		case GL_UNSIGNED_INT_10F_11F_11F_REV:	return TextureFormat::UNSIGNED_INT_11F_11F_10F_REV;
		case GL_UNSIGNED_INT_24_8:				return TextureFormat::UNSIGNED_INT_24_8;
		case GL_FLOAT_32_UNSIGNED_INT_24_8_REV:	return TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV;
		case GL_UNSIGNED_INT_5_9_9_9_REV:		return TextureFormat::UNSIGNED_INT_999_E5_REV;

		default:
			DE_ASSERT(false);
			return TextureFormat::CHANNELTYPE_LAST;
	}
}